

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_node * lyd_dup_to_ctx(lyd_node *node,int recursive,ly_ctx *ctx)

{
  LYS_NODE LVar1;
  int iVar2;
  char *pcVar3;
  lyd_node_leaf_list *leaf;
  lyd_val lVar4;
  lyd_node *plVar5;
  lyxml_elem *plVar6;
  LY_ERR *pLVar7;
  undefined8 uVar8;
  lyd_node *plVar9;
  lyd_node_leaf_list *node_00;
  lys_node *plVar10;
  ly_ctx *ctx_00;
  ly_ctx *plVar11;
  lyd_node_leaf_list *local_48;
  
  if (node == (lyd_node *)0x0) {
    pLVar7 = ly_errno_location();
    *pLVar7 = LY_EINVAL;
LAB_0015f569:
    node_00 = (lyd_node_leaf_list *)0x0;
  }
  else {
    local_48 = (lyd_node_leaf_list *)0x0;
    if (node->schema->module->ctx == ctx) {
      ctx = (ly_ctx *)0x0;
    }
    node_00 = (lyd_node_leaf_list *)0x0;
    plVar9 = node;
    do {
      plVar10 = plVar9->schema;
      LVar1 = plVar10->nodetype;
      plVar11 = ctx;
      if (0x1f < (int)LVar1) {
        if (0xff < (int)LVar1) {
          if ((LVar1 == LYS_RPC) || (LVar1 == LYS_ACTION)) goto LAB_0015f255;
          if (LVar1 != LYS_ANYDATA) goto LAB_0015f5a1;
LAB_0015f329:
          leaf = (lyd_node_leaf_list *)calloc(1,0x40);
          if (leaf == (lyd_node_leaf_list *)0x0) goto LAB_0015f51f;
          iVar2 = lyd_dup_common((lyd_node *)local_48,(lyd_node *)leaf,plVar9,ctx);
          if (iVar2 != 0) goto LAB_0015f544;
          *(undefined4 *)&leaf->value_str = *(undefined4 *)&plVar9->child;
          plVar10 = plVar9[1].schema;
          if (plVar10 != (lys_node *)0x0) {
            switch(*(undefined4 *)&plVar9->child) {
            case 0:
            case 2:
            case 4:
              if (ctx == (ly_ctx *)0x0) {
                plVar11 = plVar9->schema->module->ctx;
              }
              goto LAB_0015f3d6;
            case 1:
            case 3:
            case 5:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                            ,0x1217,
                            "struct lyd_node *lyd_dup_to_ctx(const struct lyd_node *, int, struct ly_ctx *)"
                           );
            default:
              goto switchD_0015f393_caseD_6;
            case 8:
              if (ctx == (ly_ctx *)0x0) {
                plVar11 = plVar9->schema->module->ctx;
              }
              plVar6 = lyxml_dup_elem(plVar11,(lyxml_elem *)plVar10,(lyxml_elem *)0x0,1);
              break;
            case 0x10:
              plVar6 = (lyxml_elem *)lyd_dup_to_ctx((lyd_node *)plVar10,1,ctx);
            }
LAB_0015f3dd:
            (leaf->value).instance = (lyd_node *)plVar6;
          }
          goto switchD_0015f393_caseD_6;
        }
        if (LVar1 == LYS_ANYXML) goto LAB_0015f329;
        if (LVar1 != LYS_NOTIF) goto LAB_0015f5a1;
LAB_0015f255:
        leaf = (lyd_node_leaf_list *)calloc(1,0x38);
        if (leaf == (lyd_node_leaf_list *)0x0) {
LAB_0015f51f:
          pLVar7 = ly_errno_location();
          *pLVar7 = LY_EMEM;
          leaf = (lyd_node_leaf_list *)0x0;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_dup_to_ctx");
        }
        else {
          leaf->value_str = (char *)0x0;
          iVar2 = lyd_dup_common((lyd_node *)local_48,(lyd_node *)leaf,plVar9,ctx);
          if (iVar2 == 0) goto switchD_0015f393_caseD_6;
        }
LAB_0015f544:
        if ((leaf == (lyd_node_leaf_list *)0x0) || (leaf->schema == (lys_node *)0x0)) {
          free(leaf);
        }
        else {
          lyd_free((lyd_node *)leaf);
        }
        lyd_free((lyd_node *)node_00);
        goto LAB_0015f569;
      }
      if ((int)LVar1 < 8) {
        if (LVar1 == LYS_CONTAINER) goto LAB_0015f255;
        if (LVar1 == LYS_LEAF) goto LAB_0015f298;
LAB_0015f5a1:
        pLVar7 = ly_errno_location();
        *pLVar7 = LY_EINT;
        uVar8 = 0x122c;
LAB_0015f516:
        leaf = (lyd_node_leaf_list *)0x0;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
               ,uVar8);
        goto LAB_0015f544;
      }
      if (LVar1 != LYS_LEAFLIST) {
        if (LVar1 != LYS_LIST) goto LAB_0015f5a1;
        goto LAB_0015f255;
      }
LAB_0015f298:
      leaf = (lyd_node_leaf_list *)calloc(1,0x48);
      if (leaf == (lyd_node_leaf_list *)0x0) goto LAB_0015f51f;
      ctx_00 = ctx;
      if (ctx == (ly_ctx *)0x0) {
        ctx_00 = plVar10->module->ctx;
      }
      pcVar3 = lydict_insert(ctx_00,(char *)plVar9->child,0);
      leaf->value_str = pcVar3;
      leaf->value_type = *(uint16_t *)&plVar9[1].validity;
      iVar2 = lyd_dup_common((lyd_node *)local_48,(lyd_node *)leaf,plVar9,ctx);
      if (iVar2 != 0) {
        if (leaf->schema == (lys_node *)0x0) {
          if (ctx == (ly_ctx *)0x0) {
            ctx = plVar9->schema->module->ctx;
          }
          lydict_remove(ctx,leaf->value_str);
        }
        goto LAB_0015f544;
      }
      switch(leaf->value_type) {
      case 1:
      case 10:
        lVar4 = (lyd_val)leaf->value_str;
        break;
      case 2:
      case 7:
        goto switchD_0015f31e_caseD_2;
      default:
switchD_0015f31e_caseD_3:
        lVar4 = *(lyd_val *)(plVar9 + 1);
        break;
      case 6:
        if (ctx == (ly_ctx *)0x0) goto switchD_0015f31e_caseD_3;
        goto switchD_0015f31e_caseD_2;
      case 8:
      case 9:
        (leaf->value).binary = (char *)0x0;
        goto switchD_0015f393_caseD_6;
      case 0xb:
        if (ctx == (ly_ctx *)0x0) {
          plVar11 = node->schema->module->ctx;
        }
        plVar10 = plVar9[1].schema;
LAB_0015f3d6:
        plVar6 = (lyxml_elem *)lydict_insert(plVar11,(char *)plVar10,0);
        goto LAB_0015f3dd;
      }
      leaf->value = lVar4;
switchD_0015f393_caseD_6:
      if (node_00 == (lyd_node_leaf_list *)0x0) {
        node_00 = leaf;
      }
      if (recursive == 0) {
        return (lyd_node *)node_00;
      }
      if ((plVar9->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar5 = plVar9->child;
      }
      else {
        plVar5 = (lyd_node *)0x0;
      }
      if (plVar5 == (lyd_node *)0x0) {
        if (plVar9->parent == node->parent) {
          return (lyd_node *)node_00;
        }
        plVar5 = plVar9->next;
        leaf = local_48;
      }
      if (plVar5 == (lyd_node *)0x0) {
        for (plVar9 = plVar9->parent; plVar9->parent != node->parent; plVar9 = plVar9->parent) {
          if (leaf == (lyd_node_leaf_list *)0x0) {
            pLVar7 = ly_errno_location();
            *pLVar7 = LY_EINT;
            uVar8 = 0x1250;
            goto LAB_0015f516;
          }
          leaf = (lyd_node_leaf_list *)leaf->parent;
          plVar5 = plVar9->next;
          if (plVar5 != (lyd_node *)0x0) break;
        }
      }
      plVar9 = plVar5;
      local_48 = leaf;
    } while (plVar5 != (lyd_node *)0x0);
  }
  return (lyd_node *)node_00;
switchD_0015f31e_caseD_2:
  lyp_parse_value((lys_type *)&leaf->schema[1].ref,&leaf->value_str,(lyxml_elem *)0x0,leaf,
                  (lyd_attr *)0x0,1,(byte)node->field_0x9 & 1);
  goto switchD_0015f393_caseD_6;
}

Assistant:

lyd_node *
lyd_dup_to_ctx(const struct lyd_node *node, int recursive, struct ly_ctx *ctx)
{
    const struct lyd_node *next, *elem;
    struct lyd_node *ret, *parent, *new_node = NULL;
    struct lyd_node_leaf_list *new_leaf;
    struct lyd_node_anydata *new_any, *old_any;

    if (!node) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (ctx == node->schema->module->ctx) {
        /* target context is actually the same as the source context,
         * ignore the target context */
        ctx = NULL;
    }

    ret = NULL;
    parent = NULL;

    /* LY_TREE_DFS */
    for (elem = next = node; elem; elem = next) {

        /* fill specific part */
        switch (elem->schema->nodetype) {
        case LYS_LEAF:
        case LYS_LEAFLIST:
            new_leaf = calloc(1, sizeof *new_leaf);
            new_node = (struct lyd_node *)new_leaf;
            if (!new_node) {
                LOGMEM;
                goto error;
            }

            new_leaf->value_str = lydict_insert(ctx ? ctx : elem->schema->module->ctx,
                                                ((struct lyd_node_leaf_list *)elem)->value_str, 0);
            new_leaf->value_type = ((struct lyd_node_leaf_list *)elem)->value_type;
            if (lyd_dup_common(parent, new_node, elem, ctx)) {
                if (!new_node->schema) {
                    /* in error cleanup, just free will be called instead of lyd_free(),
                     * so do the additional cleanup here */
                    lydict_remove(ctx ? ctx : elem->schema->module->ctx, new_leaf->value_str);
                }
                goto error;
            }

            switch (new_leaf->value_type) {
            case LY_TYPE_BINARY:
            case LY_TYPE_STRING:
                /* value_str pointer is shared in these cases */
                new_leaf->value.string = new_leaf->value_str;
                break;
            case LY_TYPE_LEAFREF:
                new_leaf->value.leafref = NULL;
                break;
            case LY_TYPE_INST:
                new_leaf->value.instance = NULL;
                break;
            case LY_TYPE_UNION:
                /* unresolved union (this must be non-validated tree), duplicate the stored string (duplicated
                 * because of possible change of the value in case of instance-identifier) */
                new_leaf->value.string = lydict_insert(ctx ? ctx : node->schema->module->ctx,
                                                       ((struct lyd_node_leaf_list *)elem)->value.string, 0);
                break;
            case LY_TYPE_ENUM:
                if (!ctx) {
                    /* we are still in the same context - just copy the data */
                    new_leaf->value = ((struct lyd_node_leaf_list *)elem)->value;
                    break;
                }
                /* no break */
            case LY_TYPE_IDENT:
            case LY_TYPE_BITS:
                /* in case of duplicating bits (no matter if in the same context or not) or enum and identityref into
                 * a different context, searching for the type and duplicating the data is almost as same as resolving
                 * the string value, so due to a simplicity, parse the value for the duplicated leaf */
                lyp_parse_value(&((struct lys_node_leaf *)new_leaf->schema)->type, &new_leaf->value_str, NULL,
                                new_leaf, NULL, 1, node->dflt);
                break;
            default:
                new_leaf->value = ((struct lyd_node_leaf_list *)elem)->value;
                break;
            }
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            old_any = (struct lyd_node_anydata *)elem;
            new_any = calloc(1, sizeof *new_any);
            new_node = (struct lyd_node *)new_any;
            if (!new_node) {
                LOGMEM;
                goto error;
            }
            if (lyd_dup_common(parent, new_node, elem, ctx)) {
                goto error;
            }

            new_any->value_type = old_any->value_type;
            if (!(void*)old_any->value.tree) {
                /* no value to duplicate */
                break;
            }
            /* duplicate the value */
            switch (old_any->value_type) {
            case LYD_ANYDATA_CONSTSTRING:
            case LYD_ANYDATA_SXML:
            case LYD_ANYDATA_JSON:
                new_any->value.str = lydict_insert(ctx ? ctx : elem->schema->module->ctx, old_any->value.str, 0);
                break;
            case LYD_ANYDATA_DATATREE:
                new_any->value.tree = lyd_dup_to_ctx(old_any->value.tree, 1, ctx);
                break;
            case LYD_ANYDATA_XML:
                new_any->value.xml = lyxml_dup_elem(ctx ? ctx : elem->schema->module->ctx, old_any->value.xml, NULL, 1);
                break;
            case LYD_ANYDATA_STRING:
            case LYD_ANYDATA_SXMLD:
            case LYD_ANYDATA_JSOND:
                /* dynamic strings are used only as input parameters */
                assert(0);
                break;
            }
            break;
        case LYS_CONTAINER:
        case LYS_LIST:
        case LYS_NOTIF:
        case LYS_RPC:
        case LYS_ACTION:
            new_node = calloc(1, sizeof *new_node);
            if (!new_node) {
                LOGMEM;
                goto error;
            }
            new_node->child = NULL;

            if (lyd_dup_common(parent, new_node, elem, ctx)) {
                goto error;
            }
            break;
        default:
            LOGINT;
            goto error;
        }
        if (!ret) {
            ret = new_node;
        }

        if (!recursive) {
            break;
        }

        /* LY_TREE_DFS_END */
        /* select element for the next run - children first */
        next = elem->child;
        /* child exception for lyd_node_leaf and lyd_node_leaflist */
        if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            next = NULL;
        }
        if (!next) {
            if (elem->parent == node->parent) {
                break;
            }
            /* no children, so try siblings */
            next = elem->next;
        } else {
            parent = new_node;
        }
        new_node = NULL;

        while (!next) {
            /* no siblings, go back through parents */
            elem = elem->parent;
            if (elem->parent == node->parent) {
                break;
            }
            if (!parent) {
                LOGINT;
                goto error;
            }
            parent = parent->parent;
            /* parent is already processed, go to its sibling */
            next = elem->next;
        }
    }

    return ret;

error:
    if (new_node && new_node->schema) {
        lyd_free(new_node);
    } else {
        free(new_node);
    }
    lyd_free(ret);
    return NULL;
}